

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep_test.c
# Opt level: O0

void rep_close_recv_cb(void *arg)

{
  nng_err nVar1;
  nng_msg *pnVar2;
  rep_close_recv_cb_state *state;
  void *arg_local;
  
  nng_mtx_lock(*(nng_mtx **)((long)arg + 8));
  nVar1 = nng_aio_result(*arg);
  *(nng_err *)((long)arg + 0x1c) = nVar1;
  pnVar2 = nng_aio_get_msg(*arg);
  *(nng_msg **)((long)arg + 0x20) = pnVar2;
  *(undefined4 *)((long)arg + 0x18) = 1;
  nng_cv_wake(*(nng_cv **)((long)arg + 0x10));
  nng_mtx_unlock(*(nng_mtx **)((long)arg + 8));
  return;
}

Assistant:

static void
rep_close_recv_cb(void *arg)
{
	struct rep_close_recv_cb_state *state = arg;

	nng_mtx_lock(state->mtx);
	state->result = nng_aio_result(state->aio);
	state->msg    = nng_aio_get_msg(state->aio);
	state->done   = true;
	nng_cv_wake(state->cv);
	nng_mtx_unlock(state->mtx);
}